

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__cff_skip_operand(stbtt__buf *b)

{
  byte bVar1;
  int b0;
  int v;
  stbtt__buf *b_local;
  
  bVar1 = stbtt__buf_peek8(b);
  if (bVar1 < 0x1c) {
    __assert_fail("b0 >= 28",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imstb_truetype.h"
                  ,0x4b1,"void stbtt__cff_skip_operand(stbtt__buf *)");
  }
  if (bVar1 == 0x1e) {
    stbtt__buf_skip(b,1);
    while (b->cursor < b->size) {
      bVar1 = stbtt__buf_get8(b);
      if ((bVar1 & 0xf) == 0xf) {
        return;
      }
      if ((int)(uint)bVar1 >> 4 == 0xf) {
        return;
      }
    }
  }
  else {
    stbtt__cff_int(b);
  }
  return;
}

Assistant:

static void stbtt__cff_skip_operand(stbtt__buf *b) {
   int v, b0 = stbtt__buf_peek8(b);
   STBTT_assert(b0 >= 28);
   if (b0 == 30) {
      stbtt__buf_skip(b, 1);
      while (b->cursor < b->size) {
         v = stbtt__buf_get8(b);
         if ((v & 0xF) == 0xF || (v >> 4) == 0xF)
            break;
      }
   } else {
      stbtt__cff_int(b);
   }
}